

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

Iterator * leveldb::NewMergingIterator(Comparator *comparator,Iterator **children,int n)

{
  Iterator *pIVar1;
  long *plVar2;
  CleanupFunction p_Var3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (n == 1) {
    pIVar1 = *children;
  }
  else {
    if (n == 0) {
      pIVar1 = NewEmptyIterator();
      return pIVar1;
    }
    pIVar1 = (Iterator *)operator_new(0x50);
    Iterator::Iterator(pIVar1);
    pIVar1->_vptr_Iterator = (_func_int **)&PTR__MergingIterator_0012f658;
    pIVar1[1]._vptr_Iterator = (_func_int **)comparator;
    lVar5 = (long)n;
    uVar4 = 0xffffffffffffffff;
    if (-1 < n) {
      uVar4 = lVar5 * 0x20 + 8;
    }
    plVar2 = (long *)operator_new__(uVar4);
    *plVar2 = lVar5;
    p_Var3 = (CleanupFunction)(plVar2 + 1);
    do {
      *(undefined8 *)p_Var3 = 0;
      p_Var3[8] = (code)0x0;
      *(char **)(p_Var3 + 0x10) = "";
      *(undefined8 *)(p_Var3 + 0x18) = 0;
      p_Var3 = p_Var3 + 0x20;
    } while (p_Var3 != (CleanupFunction)(plVar2 + lVar5 * 4 + 1));
    pIVar1[1].cleanup_head_.function = (CleanupFunction)(plVar2 + 1);
    *(int *)&pIVar1[1].cleanup_head_.arg1 = n;
    pIVar1[1].cleanup_head_.arg2 = (void *)0x0;
    *(undefined4 *)&pIVar1[1].cleanup_head_.next = 0;
    uVar6 = 0;
    uVar4 = (ulong)(uint)n;
    if (n < 1) {
      uVar4 = uVar6;
    }
    for (; uVar4 * 0x20 != uVar6; uVar6 = uVar6 + 0x20) {
      IteratorWrapper::Set((IteratorWrapper *)(pIVar1[1].cleanup_head_.function + uVar6),*children);
      children = children + 1;
    }
  }
  return pIVar1;
}

Assistant:

Iterator* NewMergingIterator(const Comparator* comparator, Iterator** children,
                             int n) {
  assert(n >= 0);
  if (n == 0) {
    return NewEmptyIterator();
  } else if (n == 1) {
    return children[0];
  } else {
    return new MergingIterator(comparator, children, n);
  }
}